

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O0

void nn_ws_handshake_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  nn_ws_handshake *local_38;
  size_t local_30;
  size_t i;
  nn_ws_handshake *handshaker;
  void *srcptr_local;
  int type_local;
  int src_local;
  nn_fsm *self_local;
  
  local_38 = (nn_ws_handshake *)self;
  if (self == (nn_fsm *)0x0) {
    local_38 = (nn_ws_handshake *)0x0;
  }
  switch(local_38->state) {
  case 1:
    if (src != -2) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
              ,0x1b9);
      fflush(_stderr);
      nn_err_abort();
    }
    if (type != -2) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)(uint)local_38->state,0xfffffffe,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
              ,0x1b5);
      fflush(_stderr);
      nn_err_abort();
    }
    if (local_38->recv_pos != 0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","handshaker->recv_pos == 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
              ,0x199);
      fflush(_stderr);
      nn_err_abort();
    }
    if (local_38->recv_len < 4) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
              "handshaker->recv_len >= NN_WS_HANDSHAKE_TERMSEQ_LEN",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
              ,0x19a);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_timer_start(&local_38->timer,local_38->timeout);
    if (local_38->mode == 1) {
      if (0x200 < local_38->recv_len) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                "handshaker->recv_len <= sizeof (handshaker->response)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                ,0x1a2);
        fflush(_stderr);
        nn_err_abort();
      }
      local_38->state = 4;
      nn_ws_handshake_client_request(local_38);
    }
    else {
      if (local_38->mode != 2) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                ,0x1b0);
        fflush(_stderr);
        nn_err_abort();
      }
      if (0x1000 < local_38->recv_len) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                "handshaker->recv_len <= sizeof (handshaker->opening_hs)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                ,0x1a9);
        fflush(_stderr);
        nn_err_abort();
      }
      local_38->state = 2;
      nn_usock_recv(local_38->usock,local_38->opening_hs,local_38->recv_len,(int *)0x0);
    }
    break;
  case 2:
    if (src == 1) {
      if (type == 4) {
        iVar1 = nn_ws_handshake_parse_client_opening(local_38);
        if (iVar1 == -1) {
          local_38->state = 3;
          nn_ws_handshake_server_reply(local_38);
        }
        else if (iVar1 == 0) {
          local_38->state = 3;
          nn_ws_handshake_server_reply(local_38);
        }
        else {
          if (iVar1 != 1) {
            fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n",
                    "Unexpected handshake result",(ulong)(uint)local_38->state,1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                    ,0x209);
            fflush(_stderr);
            nn_err_abort();
          }
          local_38->recv_pos = local_38->recv_len + local_38->recv_pos;
          if (0xfff < local_38->recv_pos) {
            fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                    "handshaker->recv_pos < sizeof (handshaker->opening_hs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                    ,0x1db);
            fflush(_stderr);
            nn_err_abort();
          }
          if (local_38->recv_pos < 4) {
            fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                    "handshaker->recv_pos >= (int) NN_WS_HANDSHAKE_TERMSEQ_LEN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                    ,0x1e3);
            fflush(_stderr);
            nn_err_abort();
          }
          local_30 = 4;
          while ((local_30 != 0 &&
                 (iVar1 = memcmp("\r\n\r\n",
                                 (void *)((long)local_38 + ((local_38->recv_pos + 0x180) - local_30)
                                         ),local_30), iVar1 != 0))) {
            local_30 = local_30 - 1;
          }
          if (3 < local_30) {
            fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","i < NN_WS_HANDSHAKE_TERMSEQ_LEN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                    ,0x1f1);
            fflush(_stderr);
            nn_err_abort();
          }
          local_38->recv_len = 4 - local_30;
          if (local_38->recv_len + local_38->recv_pos < 0x1001) {
            local_38->retries = local_38->retries + 1;
            nn_usock_recv(local_38->usock,local_38->opening_hs + local_38->recv_pos,
                          local_38->recv_len,(int *)0x0);
          }
          else {
            local_38->response_code = 1;
            local_38->state = 3;
            nn_ws_handshake_server_reply(local_38);
          }
        }
      }
      else if (type == 5) {
        nn_timer_stop(&local_38->timer);
        local_38->state = 7;
      }
      else if (type != 8) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)(uint)local_38->state,1,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                ,0x214);
        fflush(_stderr);
        nn_err_abort();
      }
    }
    else {
      if (src != 2) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
                (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                ,0x222);
        fflush(_stderr);
        nn_err_abort();
      }
      if (type != 1) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)(uint)local_38->state,2,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                ,0x21e);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_timer_stop(&local_38->timer);
      local_38->state = 7;
    }
    break;
  case 3:
    if (src == 1) {
      if (type == 3) {
        nn_timer_stop(&local_38->timer);
        local_38->state = 8;
      }
      else if (type == 5) {
        nn_timer_stop(&local_38->timer);
        local_38->state = 7;
      }
      else if (type != 8) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)(uint)local_38->state,1,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                ,0x23a);
        fflush(_stderr);
        nn_err_abort();
      }
    }
    else {
      if (src != 2) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
                (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                ,0x248);
        fflush(_stderr);
        nn_err_abort();
      }
      if (type != 1) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)(uint)local_38->state,2,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                ,0x244);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_timer_stop(&local_38->timer);
      local_38->state = 7;
    }
    break;
  case 4:
    if (src == 1) {
      if (type == 3) {
        local_38->state = 5;
        nn_usock_recv(local_38->usock,local_38->response,local_38->recv_len,(int *)0x0);
      }
      else if (type == 5) {
        nn_timer_stop(&local_38->timer);
        local_38->state = 7;
      }
      else if (type != 8) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)(uint)local_38->state,1,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                ,0x260);
        fflush(_stderr);
        nn_err_abort();
      }
    }
    else {
      if (src != 2) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
                (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                ,0x26e);
        fflush(_stderr);
        nn_err_abort();
      }
      if (type != 1) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)(uint)local_38->state,2,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                ,0x26a);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_timer_stop(&local_38->timer);
      local_38->state = 7;
    }
    break;
  case 5:
    if (src == 1) {
      if (type == 4) {
        iVar1 = nn_ws_handshake_parse_server_response(local_38);
        if (iVar1 == -1) {
          nn_timer_stop(&local_38->timer);
          local_38->state = 7;
        }
        else if (iVar1 == 0) {
          nn_timer_stop(&local_38->timer);
          local_38->state = 8;
        }
        else {
          if (iVar1 != 1) {
            fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n",
                    "Unexpected handshake result",(ulong)(uint)local_38->state,1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                    ,0x2ba);
            fflush(_stderr);
            nn_err_abort();
          }
          local_38->recv_pos = local_38->recv_len + local_38->recv_pos;
          if (0x1ff < local_38->recv_pos) {
            fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                    "handshaker->recv_pos < sizeof (handshaker->response)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                    ,0x291);
            fflush(_stderr);
            nn_err_abort();
          }
          if (local_38->recv_pos < 4) {
            fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                    "handshaker->recv_pos >= (int) NN_WS_HANDSHAKE_TERMSEQ_LEN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                    ,0x299);
            fflush(_stderr);
            nn_err_abort();
          }
          local_30 = 4;
          while ((local_30 != 0 &&
                 (iVar1 = memcmp("\r\n\r\n",
                                 (void *)((long)local_38 +
                                         ((local_38->recv_pos + 0x128c) - local_30)),local_30),
                 iVar1 != 0))) {
            local_30 = local_30 - 1;
          }
          if (3 < local_30) {
            fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","i < NN_WS_HANDSHAKE_TERMSEQ_LEN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                    ,0x2a4);
            fflush(_stderr);
            nn_err_abort();
          }
          local_38->recv_len = 4 - local_30;
          if (local_38->recv_len + local_38->recv_pos < 0x201) {
            local_38->retries = local_38->retries + 1;
            nn_usock_recv(local_38->usock,local_38->response + local_38->recv_pos,local_38->recv_len
                          ,(int *)0x0);
          }
          else {
            nn_timer_stop(&local_38->timer);
            local_38->state = 7;
          }
        }
      }
      else if (type == 5) {
        nn_timer_stop(&local_38->timer);
        local_38->state = 7;
      }
      else if (type != 8) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)(uint)local_38->state,1,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                ,0x2c5);
        fflush(_stderr);
        nn_err_abort();
      }
    }
    else {
      if (src != 2) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
                (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                ,0x2d3);
        fflush(_stderr);
        nn_err_abort();
      }
      if (type != 1) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)(uint)local_38->state,2,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                ,0x2cf);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_timer_stop(&local_38->timer);
      local_38->state = 7;
    }
    break;
  case 6:
    if (src == 1) {
      if (type == 3) {
        nn_timer_stop(&local_38->timer);
        local_38->state = 8;
      }
      else if (type == 5) {
        nn_timer_stop(&local_38->timer);
        local_38->state = 7;
      }
      else if (type != 8) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)(uint)local_38->state,1,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                ,0x2ec);
        fflush(_stderr);
        nn_err_abort();
      }
    }
    else {
      if (src != 2) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
                (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                ,0x2fa);
        fflush(_stderr);
        nn_err_abort();
      }
      if (type != 1) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)(uint)local_38->state,2,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                ,0x2f6);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_timer_stop(&local_38->timer);
      local_38->state = 7;
    }
    break;
  case 7:
    if (src != 1) {
      if (src != 2) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
                (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                ,0x313);
        fflush(_stderr);
        nn_err_abort();
      }
      if (type != 2) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)(uint)local_38->state,2,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                ,0x30f);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_ws_handshake_leave(local_38,2);
    }
    break;
  case 8:
    if (src != 1) {
      if (src != 2) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
                (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                ,0x32c);
        fflush(_stderr);
        nn_err_abort();
      }
      if (type != 2) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)(uint)local_38->state,2,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                ,0x328);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_ws_handshake_leave(local_38,1);
    }
    break;
  case 9:
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
            (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
            ,0x335);
    fflush(_stderr);
    nn_err_abort();
  default:
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
            (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
            ,0x33b);
    fflush(_stderr);
    nn_err_abort();
  }
  return;
}

Assistant:

static void nn_ws_handshake_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_ws_handshake *handshaker;

    size_t i;

    handshaker = nn_cont (self, struct nn_ws_handshake, fsm);

    switch (handshaker->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_assert (handshaker->recv_pos == 0);
                nn_assert (handshaker->recv_len >= NN_WS_HANDSHAKE_TERMSEQ_LEN);

                nn_timer_start (&handshaker->timer, handshaker->timeout);

                switch (handshaker->mode) {
                case NN_WS_CLIENT:
                    /*  Send opening handshake to server. */
                    nn_assert (handshaker->recv_len <=
                        sizeof (handshaker->response));
                    handshaker->state = NN_WS_HANDSHAKE_STATE_CLIENT_SEND;
                    nn_ws_handshake_client_request (handshaker);
                    return;
                case NN_WS_SERVER:
                    /*  Begin receiving opening handshake from client. */
                    nn_assert (handshaker->recv_len <=
                        sizeof (handshaker->opening_hs));
                    handshaker->state = NN_WS_HANDSHAKE_STATE_SERVER_RECV;
                    nn_usock_recv (handshaker->usock, handshaker->opening_hs,
                        handshaker->recv_len, NULL);
                    return;
                default:
                    /*  Unexpected mode. */
                    nn_assert (0);
                    return;
                }

            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  SERVER_RECV state.                                                        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_SERVER_RECV:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_RECEIVED:
                /*  Parse bytes received thus far. */
                switch (nn_ws_handshake_parse_client_opening (handshaker)) {
                case NN_WS_HANDSHAKE_INVALID:
                    /*  Opening handshake parsed successfully but does not
                        contain valid values. Respond failure to client. */
                    handshaker->state = NN_WS_HANDSHAKE_STATE_SERVER_REPLY;
                    nn_ws_handshake_server_reply (handshaker);
                    return;
                case NN_WS_HANDSHAKE_VALID:
                    /*  Opening handshake parsed successfully, and is valid.
                        Respond success to client. */
                    handshaker->state = NN_WS_HANDSHAKE_STATE_SERVER_REPLY;
                    nn_ws_handshake_server_reply (handshaker);
                    return;
                case NN_WS_HANDSHAKE_RECV_MORE:
                    /*  Not enough bytes have been received to determine
                        validity; remain in the receive state, and retrieve
                        more bytes from client. */
                    handshaker->recv_pos += handshaker->recv_len;

                    /*  Validate the previous recv operation. */
                    nn_assert (handshaker->recv_pos <
                        sizeof (handshaker->opening_hs));

                    /*  Ensure we can back-track at least the length of the
                        termination sequence to determine how many bytes to
                        receive on the next retry. This is an assertion, not
                        a conditional, since under no condition is it
                        necessary to initially receive so few bytes. */
                    nn_assert (handshaker->recv_pos >=
                        (int) NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    /*  We only compare if we have at least one byte to
                        compare against.  When i drops to zero, it means
                        we don't have any bytes to match against, and it is
                        automatically true. */
                    for (i = NN_WS_HANDSHAKE_TERMSEQ_LEN; i > 0; i--) {
                        if (memcmp (NN_WS_HANDSHAKE_TERMSEQ,
                            handshaker->opening_hs + handshaker->recv_pos - i,
                            i) == 0) {
                            break;
                        }
                    }

                    nn_assert (i < NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    handshaker->recv_len = NN_WS_HANDSHAKE_TERMSEQ_LEN - i;

                    /*  In the unlikely case the client would overflow what we
                        assumed was a sufficiently-large buffer to receive the
                        handshake, we fail the client. */
                    if (handshaker->recv_len + handshaker->recv_pos >
                        sizeof (handshaker->opening_hs)) {
                        handshaker->response_code =
                            NN_WS_HANDSHAKE_RESPONSE_TOO_BIG;
                        handshaker->state =
                            NN_WS_HANDSHAKE_STATE_SERVER_REPLY;
                        nn_ws_handshake_server_reply (handshaker);
                    }
                    else {
                        handshaker->retries++;
                        nn_usock_recv (handshaker->usock,
                            handshaker->opening_hs + handshaker->recv_pos,
                            handshaker->recv_len, NULL);
                    }
                    return;
                default:
                    nn_fsm_error ("Unexpected handshake result",
                        handshaker->state, src, type);
                }
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  SERVER_REPLY state.                                                       */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_SERVER_REPLY:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                /*  As per RFC 6455 4.2.2, the handshake is now complete
                    and the connection is immediately ready for send/recv. */
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  CLIENT_SEND state.                                                        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_CLIENT_SEND:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                handshaker->state = NN_WS_HANDSHAKE_STATE_CLIENT_RECV;
                nn_usock_recv (handshaker->usock, handshaker->response,
                    handshaker->recv_len, NULL);
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  CLIENT_RECV state.                                                        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_CLIENT_RECV:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_RECEIVED:
                /*  Parse bytes received thus far. */
                switch (nn_ws_handshake_parse_server_response (handshaker)) {
                case NN_WS_HANDSHAKE_INVALID:
                    /*  Opening handshake parsed successfully but does not
                        contain valid values. Fail connection. */
                        nn_timer_stop (&handshaker->timer);
                        handshaker->state =
                            NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                    return;
                case NN_WS_HANDSHAKE_VALID:
                    /*  As per RFC 6455 4.2.2, the handshake is now complete
                        and the connection is immediately ready for send/recv. */
                    nn_timer_stop (&handshaker->timer);
                    handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE;
                    return;
                case NN_WS_HANDSHAKE_RECV_MORE:
                    /*  Not enough bytes have been received to determine
                        validity; remain in the receive state, and retrieve
                        more bytes from client. */
                    handshaker->recv_pos += handshaker->recv_len;

                    /*  Validate the previous recv operation. */
                    nn_assert (handshaker->recv_pos <
                        sizeof (handshaker->response));

                    /*  Ensure we can back-track at least the length of the
                        termination sequence to determine how many bytes to
                        receive on the next retry. This is an assertion, not
                        a conditional, since under no condition is it
                        necessary to initially receive so few bytes. */
                    nn_assert (handshaker->recv_pos >=
                        (int) NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    /*  If i goes to 0, it no need to compare. */
                    for (i = NN_WS_HANDSHAKE_TERMSEQ_LEN; i > 0; i--) {
                        if (memcmp (NN_WS_HANDSHAKE_TERMSEQ,
                            handshaker->response + handshaker->recv_pos - i,
                            i) == 0) {
                            break;
                        }
                    }

                    nn_assert (i < NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    handshaker->recv_len = NN_WS_HANDSHAKE_TERMSEQ_LEN - i;

                    /*  In the unlikely case the client would overflow what we
                        assumed was a sufficiently-large buffer to receive the
                        handshake, we fail the connection. */
                    if (handshaker->recv_len + handshaker->recv_pos >
                        sizeof (handshaker->response)) {
                        nn_timer_stop (&handshaker->timer);
                        handshaker->state =
                            NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                    }
                    else {
                        handshaker->retries++;
                        nn_usock_recv (handshaker->usock,
                            handshaker->response + handshaker->recv_pos,
                            handshaker->recv_len, NULL);
                    }
                    return;
                default:
                    nn_fsm_error ("Unexpected handshake result",
                        handshaker->state, src, type);
                }
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  HANDSHAKE_SENT state.                                                     */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_HANDSHAKE_SENT:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                /*  As per RFC 6455 4.2.2, the handshake is now complete
                    and the connection is immediately ready for send/recv. */
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE;
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER_ERROR state.                                               */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            /*  Ignore. The only circumstance the client would send bytes is
                to notify the server it is closing the connection. Wait for the
                socket to eventually error. */
            return;

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_ws_handshake_leave (handshaker, NN_WS_HANDSHAKE_ERROR);
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER_DONE state.                                                */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            /*  Ignore. The only circumstance the client would send bytes is
                to notify the server it is closing the connection. Wait for the
                socket to eventually error. */
            return;

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_ws_handshake_leave (handshaker, NN_WS_HANDSHAKE_OK);
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  DONE state.                                                               */
/*  The header exchange was either done successfully of failed. There's       */
/*  nothing that can be done in this state except stopping the object.        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_DONE:
        nn_fsm_bad_source (handshaker->state, src, type);

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (handshaker->state, src, type);
    }
}